

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

void CVmObjList::remove_range
               (vm_val_t *retval,vm_val_t *self_val,char *lst,int start_idx,int del_cnt)

{
  vm_obj_id_t obj;
  size_t sVar1;
  CVmObject *ele_array;
  char *lstval;
  int in_ECX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  int in_R8D;
  CVmObjList *new_lst;
  size_t lst_len;
  vm_val_t *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  CVmObject *in_stack_ffffffffffffffc0;
  
  CVmStack::push(in_RSI);
  sVar1 = vmb_get_len((char *)0x31c600);
  obj = create((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(size_t)in_stack_ffffffffffffffa8);
  vm_val_t::set_obj(in_RDI,obj);
  CVmStack::push(in_RDI);
  ele_array = vm_objp(0);
  lstval = vm_val_t::get_as_list(in_stack_ffffffffffffffa8);
  if (in_ECX != 0) {
    in_stack_ffffffffffffffc0 = ele_array;
    get_element_ptr_const(lstval,0);
    cons_copy_data((CVmObjList *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  }
  if ((ulong)(long)(in_ECX + in_R8D) < sVar1) {
    sVar1 = (size_t)in_ECX;
    get_element_ptr_const(lstval,(long)(in_ECX + in_R8D));
    cons_copy_data((CVmObjList *)in_stack_ffffffffffffffc0,sVar1,(char *)ele_array,
                   (size_t)in_stack_ffffffffffffffa8);
  }
  CVmStack::discard(2);
  return;
}

Assistant:

void CVmObjList::remove_range(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *lst, int start_idx, int del_cnt)
{
    size_t lst_len;
    CVmObjList *new_lst;

    /* push myself onto the stack for GC protection */
    G_stk->push(self_val);

    /* get the original list length */
    lst_len = vmb_get_len(lst);
    
    /* 
     *   allocate a new list with space for the original list minus the
     *   elements to be deleted 
     */
    retval->set_obj(create(vmg_ FALSE, lst_len - del_cnt));

    /* push a reference to teh new list for gc protection */
    G_stk->push(retval);

    /* get the return value list data */
    new_lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* get the original list data as well */
    lst = self_val->get_as_list(vmg0_);

    /* 
     *   copy elements from the original list up to the first item to be
     *   removed 
     */
    if (start_idx != 0)
        new_lst->cons_copy_data(0, get_element_ptr_const(lst, 0), start_idx);

    /* 
     *   copy elements of the original list following the last item to be
     *   removed 
     */
    if ((size_t)(start_idx + del_cnt) < lst_len)
        new_lst->
            cons_copy_data(start_idx,
                           get_element_ptr_const(lst, start_idx + del_cnt),
                           lst_len - (start_idx + del_cnt));

    /* discard the gc protection */
    G_stk->discard(2);
}